

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

void __thiscall
pbrt::PtexTextureBase::PtexTextureBase
          (PtexTextureBase *this,string *filename,ColorEncodingHandle *encoding)

{
  PtexCache *pPVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  string *in_RSI;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  PtexTexture *texture;
  String error;
  bool premultiply;
  size_t maxMem;
  int maxFiles;
  ColorEncodingHandle *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  PtexErrorHandler *in_stack_ffffffffffffff70;
  string *this_00;
  PtexInputHandler *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 premultiply_00;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  LogLevel in_stack_ffffffffffffffc4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  
  premultiply_00 = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
  std::__cxx11::string::string((string *)args_00,in_RSI);
  ColorEncodingHandle::ColorEncodingHandle
            ((ColorEncodingHandle *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  if (cache == (PtexCache *)0x0) {
    cache = Ptex::v2_2::PtexCache::create
                      ((int)((ulong)in_RDI >> 0x20),(size_t)args_00,(bool)premultiply_00,
                       in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  *in_RDI = '\0';
  this_00 = (string *)&stack0xffffffffffffffa8;
  std::__cxx11::string::string(this_00);
  pPVar1 = cache;
  uVar3 = std::__cxx11::string::c_str();
  iVar2 = (*pPVar1->_vptr_PtexCache[5])(pPVar1,uVar3,this_00);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(extraout_var,iVar2);
  if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Error<std::__cxx11::string&>(in_RDI,args_00);
    goto LAB_004f7bb0;
  }
  iVar2 = (**(code **)(*(long *)args + 0x58))();
  if (iVar2 == 1) {
LAB_004f7b63:
    *in_RDI = '\x01';
    if (LOGGING_LogLevel < 1) {
      Log<std::__cxx11::string_const&>
                (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                 in_stack_ffffffffffffffa8,args);
    }
  }
  else {
    iVar2 = (**(code **)(*(long *)args + 0x58))();
    if (iVar2 == 3) goto LAB_004f7b63;
    Error<std::__cxx11::string_const&>(in_RDI,args_00);
  }
  (**(code **)(*(long *)args + 0x10))();
LAB_004f7bb0:
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return;
}

Assistant:

PtexTextureBase::PtexTextureBase(const std::string &filename,
                                 ColorEncodingHandle encoding)
    : filename(filename), encoding(encoding) {
    if (cache == nullptr) {
        int maxFiles = 100;
        size_t maxMem = 1ull << 32;  // 4GB
        bool premultiply = true;

        cache = Ptex::PtexCache::create(maxFiles, maxMem, premultiply, nullptr,
                                        &errorHandler);
        // TODO? cache->setSearchPath(...);
    }

    // Issue an error if the texture doesn't exist or has an unsupported
    // number of channels.
    valid = false;
    Ptex::String error;
    Ptex::PtexTexture *texture = cache->get(filename.c_str(), error);
    if (texture == nullptr)
        Error("%s", error);
    else {
        if (texture->numChannels() != 1 && texture->numChannels() != 3)
            Error("%s: only one and three channel ptex textures are supported", filename);
        else {
            valid = true;
            LOG_VERBOSE("%s: added ptex texture", filename);
        }
        texture->release();
    }
}